

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_1)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_0016dd00;
  TestCaseInfo::TestCaseInfo(&this->testInfo,&param_1->testInfo);
  sVar1 = (param_1->totals).assertions.passed;
  sVar2 = (param_1->totals).assertions.failed;
  sVar3 = (param_1->totals).assertions.failedButOk;
  sVar4 = (param_1->totals).testCases.passed;
  sVar5 = (param_1->totals).testCases.failedButOk;
  (this->totals).testCases.failed = (param_1->totals).testCases.failed;
  (this->totals).testCases.failedButOk = sVar5;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).testCases.passed = sVar4;
  (this->totals).assertions.passed = sVar1;
  (this->totals).assertions.failed = sVar2;
  std::__cxx11::string::string((string *)&this->stdOut,(string *)&param_1->stdOut);
  std::__cxx11::string::string((string *)&this->stdErr,(string *)&param_1->stdErr);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;